

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::ByteSizeLong
          (CustomLayerParams_CustomLayerParamValue *this)

{
  ValueCase VVar1;
  int32 value;
  int iVar2;
  string *value_00;
  int64 value_01;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  CustomLayerParams_CustomLayerParamValue *this_local;
  
  sStack_18 = 0;
  VVar1 = value_case(this);
  switch(VVar1) {
  case VALUE_NOT_SET:
    break;
  case kDoubleValue:
    sStack_18 = 9;
    break;
  case kStringValue:
    value_00 = stringvalue_abi_cxx11_(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::StringSize(value_00);
    sStack_18 = sStack_18 + 2;
    break;
  case kIntValue:
    value = intvalue(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::Int32Size(value);
    sStack_18 = sStack_18 + 2;
    break;
  case kLongValue:
    value_01 = longvalue(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::Int64Size(value_01);
    sStack_18 = sStack_18 + 2;
    break;
  case kBoolValue:
    sStack_18 = 3;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t CustomLayerParams_CustomLayerParamValue::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
  size_t total_size = 0;

  switch (value_case()) {
    // double doubleValue = 10;
    case kDoubleValue: {
      total_size += 1 + 8;
      break;
    }
    // string stringValue = 20;
    case kStringValue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->stringvalue());
      break;
    }
    // int32 intValue = 30;
    case kIntValue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->intvalue());
      break;
    }
    // int64 longValue = 40;
    case kLongValue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->longvalue());
      break;
    }
    // bool boolValue = 50;
    case kBoolValue: {
      total_size += 2 + 1;
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}